

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Float __thiscall pbrt::RealisticCamera::FocusThickLens(RealisticCamera *this,Float focusDistance)

{
  float fVar1;
  reference pvVar2;
  char *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  float *in_stack_00000020;
  Float delta;
  Float c;
  Float z;
  Float f;
  Float fz [2];
  Float pz [2];
  Float *in_stack_00000170;
  Float *in_stack_00000178;
  RealisticCamera *in_stack_00000180;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  char *fmt;
  
  fmt = in_RDI;
  ComputeThickLensApproximation(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  if (logging::logLevel < 1) {
    Log<float&,float&,float&,float&>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,fmt,
               (float *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
               (float *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_00000020,_delta);
  }
  if (logging::logLevel < 1) {
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe4 - in_stack_ffffffffffffffec;
    Log<float>(in_stack_00000014,in_stack_00000008,unaff_retaddr,fmt,
               (float *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0));
  }
  in_XMM0_Da = -in_XMM0_Da;
  fVar1 = ((in_stack_fffffffffffffff0 - in_XMM0_Da) - in_stack_ffffffffffffffec) *
          (((in_stack_fffffffffffffff0 - in_XMM0_Da) -
           (in_stack_ffffffffffffffe4 - in_stack_ffffffffffffffec) * 4.0) -
          in_stack_ffffffffffffffec);
  if (fVar1 <= 0.0) {
    ErrorExit<float&>((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (float *)CONCAT44(in_stack_ffffffffffffffe4 - in_stack_ffffffffffffffec,
                                        in_XMM0_Da));
  }
  dVar3 = std::sqrt((double)(ulong)(uint)fVar1);
  pvVar2 = pstd::
           vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
           ::back((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                   *)(in_RDI + 0x390));
  return pvVar2->thickness +
         (((in_stack_fffffffffffffff0 - in_XMM0_Da) + in_stack_ffffffffffffffec) - SUB84(dVar3,0)) /
         2.0;
}

Assistant:

Float RealisticCamera::FocusThickLens(Float focusDistance) {
    Float pz[2], fz[2];
    ComputeThickLensApproximation(pz, fz);
    LOG_VERBOSE("Cardinal points: p' = %f f' = %f, p = %f f = %f.\n", pz[0], fz[0], pz[1],
                fz[1]);
    LOG_VERBOSE("Effective focal length %f\n", fz[0] - pz[0]);
    // Compute translation of lens, _delta_, to focus at _focusDistance_
    Float f = fz[0] - pz[0];
    Float z = -focusDistance;
    Float c = (pz[1] - z - pz[0]) * (pz[1] - z - 4 * f - pz[0]);
    if (c <= 0)
        ErrorExit("Coefficient must be positive. It looks focusDistance %f "
                  " is too short for a given lenses configuration",
                  focusDistance);
    Float delta = (pz[1] - z + pz[0] - std::sqrt(c)) / 2;

    return elementInterfaces.back().thickness + delta;
}